

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O0

bool __thiscall ON_NurbsSurface::Extend(ON_NurbsSurface *this,int dir,ON_Interval *domain)

{
  uint uVar1;
  ON_NurbsCurve *pOVar2;
  undefined1 local_70 [8];
  ON_NurbsCurve crv;
  bool rc;
  ON_Interval *domain_local;
  int dir_local;
  ON_NurbsSurface *this_local;
  
  crv.m_cv._7_1_ = 0;
  if ((dir < 0) || (1 < dir)) {
    this_local._7_1_ = false;
  }
  else {
    uVar1 = (*(this->super_ON_Surface).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x30])
                      (this,(ulong)(uint)dir);
    if ((uVar1 & 1) == 0) {
      ON_NurbsCurve::ON_NurbsCurve((ON_NurbsCurve *)local_70);
      pOVar2 = ToCurve(this,dir,(ON_NurbsCurve *)local_70);
      if (pOVar2 != (ON_NurbsCurve *)0x0) {
        crv.m_cv._7_1_ = ON_NurbsCurve::Extend((ON_NurbsCurve *)local_70,domain);
        FromCurve((ON_NurbsCurve *)local_70,this,dir);
      }
      if ((crv.m_cv._7_1_ & 1) != 0) {
        ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
      }
      this_local._7_1_ = (bool)(crv.m_cv._7_1_ & 1);
      ON_NurbsCurve::~ON_NurbsCurve((ON_NurbsCurve *)local_70);
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_NurbsSurface::Extend(
      int dir,
      const ON_Interval& domain
      )
{

  bool rc = false;
  if ( dir < 0 || dir > 1 )
    return false;
  if (IsClosed(dir)) return false;

  ON_NurbsCurve crv;
  if ( ToCurve(*this,dir,&crv) )
  {
    rc = crv.Extend( domain );
    FromCurve( crv, *this, dir );
  }

  if (rc){
    DestroySurfaceTree();
  }
  return rc;

}